

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

Status __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolver::ResolveEnumType
          (DescriptorPoolTypeResolver *this,string *type_url,Enum *enum_type)

{
  EnumDescriptor *descriptor;
  char *pcVar1;
  Enum *in_RCX;
  InternalMetadata IVar2;
  string_view type_url_00;
  string_view name;
  string_view message;
  Status status;
  string type_name;
  undefined1 local_100 [48];
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Enum local_b8;
  AlphaNum local_50;
  
  local_100._16_8_ = (AlphaNum *)0x0;
  local_100[0x18] = '\0';
  type_url_00._M_str = (char *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_
  ;
  type_url_00._M_len = (size_t)type_url;
  local_100._8_8_ = local_100 + 0x18;
  ParseTypeUrl((DescriptorPoolTypeResolver *)local_100,type_url_00,
               (string *)(enum_type->super_Message).super_MessageLite._vptr_MessageLite);
  if ((StatusRep *)local_100._0_8_ == (StatusRep *)0x1) {
    name._M_str = (char *)local_100._8_8_;
    name._M_len = local_100._16_8_;
    descriptor = DescriptorPool::FindEnumTypeByName
                           ((DescriptorPool *)type_url[1]._M_string_length,name);
    if (descriptor == (EnumDescriptor *)0x0) {
      local_b8.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)&DAT_00000020;
      local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0x14681b8;
      local_50.piece_._M_len = local_100._16_8_;
      local_50.piece_._M_str = (char *)local_100._8_8_;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)(local_100 + 0x28),(lts_20250127 *)&local_b8,&local_50,
                 (AlphaNum *)local_100._16_8_);
      message._M_str = local_d0;
      message._M_len = (size_t)this;
      absl::lts_20250127::InvalidArgumentError(message);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._40_8_ != &local_c8) {
        operator_delete((void *)local_100._40_8_,local_c8._M_allocated_capacity + 1);
      }
    }
    else {
      ConvertDescriptorToType(&local_b8,descriptor);
      if (&local_b8 != in_RCX) {
        pcVar1 = (char *)(in_RCX->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pcVar1 & 1) != 0) {
          pcVar1 = *(char **)((ulong)pcVar1 & 0xfffffffffffffffe);
        }
        IVar2.ptr_ = local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_;
        if ((local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
          IVar2.ptr_ = *(ulong *)(local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_
                                 & 0xfffffffffffffffe);
        }
        if (pcVar1 == (char *)IVar2.ptr_) {
          Enum::InternalSwap(in_RCX,&local_b8);
        }
        else {
          Enum::CopyFrom(in_RCX,&local_b8);
        }
      }
      Enum::~Enum(&local_b8);
      (this->super_TypeResolver)._vptr_TypeResolver = (_func_int **)0x1;
    }
  }
  else {
    (this->super_TypeResolver)._vptr_TypeResolver = (_func_int **)local_100._0_8_;
    local_100._0_8_ = (StatusRep *)0x37;
  }
  if ((local_100._0_8_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_100._0_8_);
  }
  if ((undefined1 *)local_100._8_8_ != local_100 + 0x18) {
    operator_delete((void *)local_100._8_8_,CONCAT71(local_100._25_7_,local_100[0x18]) + 1);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ResolveEnumType(const std::string& type_url,
                               Enum* enum_type) override {
    std::string type_name;
    absl::Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const EnumDescriptor* descriptor = pool_->FindEnumTypeByName(type_name);
    if (descriptor == nullptr) {
      return absl::InvalidArgumentError(
          absl::StrCat("Invalid type URL, unknown type: ", type_name));
    }
    *enum_type = ConvertDescriptorToType(*descriptor);
    return absl::Status();
  }